

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_gnuplot(REF_HISTOGRAM ref_histogram,char *description)

{
  int iVar1;
  FILE *__stream;
  double dVar2;
  double dVar3;
  REF_DBL portion;
  REF_DBL norm;
  char local_438 [4];
  REF_INT sum;
  char filename [1024];
  FILE *f;
  REF_INT i;
  char *description_local;
  REF_HISTOGRAM ref_histogram_local;
  
  norm._4_4_ = 0;
  for (f._4_4_ = 0; f._4_4_ < ref_histogram->nbin; f._4_4_ = f._4_4_ + 1) {
    norm._4_4_ = ref_histogram->bins[f._4_4_] + norm._4_4_;
  }
  portion = 0.0;
  if (0 < norm._4_4_) {
    portion = 1.0 / (double)norm._4_4_;
  }
  snprintf(local_438,0x400,"ref_histogram_%s.gnuplot",description);
  __stream = fopen(local_438,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",local_438);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0xdb,"ref_histogram_gnuplot","unable to open file");
    ref_histogram_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"set terminal postscript eps enhanced color\n");
    snprintf(local_438,0x400,"ref_histogram_%s.eps",description);
    fprintf(__stream,"set output \'%s\'\n",local_438);
    fprintf(__stream,"set style data histogram\n");
    fprintf(__stream,"set style histogram cluster gap 1\n");
    fprintf(__stream,"set style fill solid border -1\n");
    fprintf(__stream,"set boxwidth 0.9\n");
    fprintf(__stream,"set xtic rotate by -45 scale 0\n");
    fprintf(__stream,"set yrange [0:0.4]\n");
    fprintf(__stream,"set format y \"%%.2f\"\n");
    fprintf(__stream,"plot \'-\' using 2:xticlabels(1) title \'%s\' linecolor rgb \"#FF0000\"\n",
            description);
    for (f._4_4_ = 0; f._4_4_ < ref_histogram->nbin + -1; f._4_4_ = f._4_4_ + 1) {
      iVar1 = ref_histogram->bins[f._4_4_];
      dVar2 = pow(2.0,(1.0 / ref_histogram->exp) * (double)(f._4_4_ - ref_histogram->nbin / 2));
      dVar3 = pow(2.0,(1.0 / ref_histogram->exp) * (double)((f._4_4_ + 1) - ref_histogram->nbin / 2)
                 );
      fprintf(__stream,"%.2f-%.2f %.5f\n",dVar2,dVar3,(double)iVar1 * portion);
    }
    fclose(__stream);
    ref_histogram_local._4_4_ = 0;
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gnuplot(REF_HISTOGRAM ref_histogram,
                                         const char *description) {
  REF_INT i;
  FILE *f;
  char filename[1024];
  REF_INT sum;
  REF_DBL norm, portion;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  snprintf(filename, 1024, "ref_histogram_%s.gnuplot", description);
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "set terminal postscript eps enhanced color\n");
  snprintf(filename, 1024, "ref_histogram_%s.eps", description);
  fprintf(f, "set output '%s'\n", filename);

  fprintf(f, "set style data histogram\n");
  fprintf(f, "set style histogram cluster gap 1\n");
  fprintf(f, "set style fill solid border -1\n");
  fprintf(f, "set boxwidth 0.9\n");
  fprintf(f, "set xtic rotate by -45 scale 0\n");
  fprintf(f, "set yrange [0:0.4]\n");
  fprintf(f, "set format y \"%%.2f\"\n");
  fprintf(
      f,
      "plot '-' using 2:xticlabels(1) title '%s' linecolor rgb \"#FF0000\"\n",
      description);

  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 1; i++) {
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) * norm;
    fprintf(f, "%.2f-%.2f %.5f\n", ref_histogram_to_obs(i),
            ref_histogram_to_obs(i + 1), portion);
  }

  fclose(f);

  return REF_SUCCESS;
}